

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::StyledWriter(StyledWriter *this)

{
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__StyledWriter_00149800;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->document_)._M_dataplus._M_p = (pointer)&(this->document_).field_2;
  (this->document_)._M_string_length = 0;
  (this->document_).field_2._M_local_buf[0] = '\0';
  (this->indentString_)._M_dataplus._M_p = (pointer)&(this->indentString_).field_2;
  (this->indentString_)._M_string_length = 0;
  (this->indentString_).field_2._M_local_buf[0] = '\0';
  this->rightMargin_ = 0x4a;
  this->indentSize_ = 3;
  this->addChildValues_ = false;
  return;
}

Assistant:

StyledWriter::StyledWriter() = default;